

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Cec(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Cex_t *pAVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  Gia_Man_t *p;
  int iVar5;
  uint uVar6;
  int iVar7;
  char **ppcVar8;
  FILE *pFVar9;
  Gia_Man_t *pGVar10;
  Gia_Man_t *pInit;
  char *pcVar11;
  char *pcVar12;
  long lVar13;
  Abc_Frame_t *pAbc_00;
  Gia_Man_t **ppGVar14;
  Cec_ParCec_t ParsCec;
  Gia_Man_t *local_88;
  Abc_Frame_t *local_80;
  Gia_Man_t *local_78;
  Cec_ParCec_t local_6c;
  char *local_48 [3];
  
  local_88 = (Gia_Man_t *)0x0;
  bVar3 = false;
  local_78 = (Gia_Man_t *)0x0;
  local_80 = pAbc;
  Cec_ManCecSetDefaultParams(&local_6c);
  Extra_UtilGetoptReset();
  bVar2 = false;
  bVar4 = false;
  do {
    while (iVar5 = Extra_UtilGetopt(argc,argv,"CTnmdasvh"), pAbc_00 = local_80,
          iVar7 = globalUtilOptind, 0x60 < iVar5) {
      switch(iVar5) {
      case 0x6d:
        bVar3 = (bool)(bVar3 ^ 1);
        break;
      case 0x6e:
        local_6c.fNaive = local_6c.fNaive ^ 1;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x72:
      case 0x74:
      case 0x75:
        goto switchD_00280f3e_caseD_6f;
      case 0x73:
        local_6c.fSilent = local_6c.fSilent ^ 1;
        break;
      case 0x76:
        local_6c.fVerbose = local_6c.fVerbose ^ 1;
        break;
      default:
        if (iVar5 == 0x61) {
          bVar4 = (bool)(bVar4 ^ 1);
        }
        else {
          if (iVar5 != 100) goto switchD_00280f3e_caseD_6f;
          bVar2 = (bool)(bVar2 ^ 1);
        }
      }
    }
    if (iVar5 == 0x43) {
      if (argc <= globalUtilOptind) {
        pcVar11 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_00281007:
        Abc_Print(-1,pcVar11);
        break;
      }
      uVar6 = atoi(argv[globalUtilOptind]);
      local_6c.nBTLimit = uVar6;
    }
    else {
      if (iVar5 != 0x54) {
        if (iVar5 == -1) {
          if (bVar3) {
            pGVar10 = local_80->pGia;
            if (argc == globalUtilOptind && pGVar10 != (Gia_Man_t *)0x0) {
              if (!bVar2) {
                if (local_6c.fSilent == 0) {
                  Abc_Print(1,"Assuming the current network is a single-output miter.\n");
                  pGVar10 = pAbc_00->pGia;
                }
                pGVar10 = Gia_ManDemiterToDual(pGVar10);
                iVar7 = Cec_ManVerify(pGVar10,&local_6c);
                pAbc_00->Status = iVar7;
                pAVar1 = pAbc_00->pGia->pCexComb;
                pAbc_00->pGia->pCexComb = pGVar10->pCexComb;
                pGVar10->pCexComb = pAVar1;
                Gia_ManStop(pGVar10);
LAB_002812e2:
                Abc_FrameReplaceCex(pAbc_00,&pAbc_00->pGia->pCexComb);
                return 0;
              }
              if ((pGVar10->vCos->nSize - pGVar10->nRegs & 1U) == 0) {
                if (local_6c.fSilent == 0) {
                  Abc_Print(1,"Assuming the current network is a double-output miter.\n");
                  pGVar10 = pAbc_00->pGia;
                }
                iVar7 = Cec_ManVerify(pGVar10,&local_6c);
                pAbc_00->Status = iVar7;
                goto LAB_002812e2;
              }
              pcVar11 = "The dual-output miter should have an even number of outputs.\n";
            }
            else {
              pcVar11 = 
              "Abc_CommandAbc9Cec(): A miter cannot be given as an argument of command &cec and should be entered using &r.\n"
              ;
            }
          }
          else {
            iVar7 = argc - globalUtilOptind;
            if (iVar7 < 3) {
              if (iVar7 == 2) {
                ppcVar8 = local_48;
                local_48[0] = argv[globalUtilOptind];
                local_48[1] = (argv + globalUtilOptind)[1];
                lVar13 = 0;
                ppGVar14 = &local_88;
                bVar2 = true;
                goto LAB_002811fc;
              }
              pGVar10 = local_80->pGia;
              if (pGVar10 == (Gia_Man_t *)0x0) {
                pcVar11 = "Abc_CommandAbc9Cec(): There is no current AIG.\n";
              }
              else {
                local_88 = pGVar10;
                if (iVar7 == 1) {
                  pcVar11 = argv[globalUtilOptind];
                  pcVar12 = pcVar11;
                  goto LAB_0028139f;
                }
                if (argc != globalUtilOptind) {
                  __assert_fail("nArgcNew == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abc.c"
                                ,0x9091,"int Abc_CommandAbc9Cec(Abc_Frame_t *, int, char **)");
                }
                pcVar11 = pGVar10->pSpec;
                pcVar12 = pcVar11;
                if (pcVar11 != (char *)0x0) goto LAB_0028139f;
                pcVar11 = "File name is not given on the command line.\n";
              }
            }
            else {
              pcVar11 = "Abc_CommandAbc9Cec(): Wrong number of command-line arguments.\n";
            }
          }
          iVar7 = -1;
          goto LAB_00281146;
        }
        break;
      }
      if (argc <= globalUtilOptind) {
        pcVar11 = "Command line switch \"-T\" should be followed by an integer.\n";
        goto LAB_00281007;
      }
      uVar6 = atoi(argv[globalUtilOptind]);
      local_6c.TimeLimit = uVar6;
    }
    globalUtilOptind = iVar7 + 1;
  } while (-1 < (int)uVar6);
switchD_00280f3e_caseD_6f:
  Abc_Print(-2,"usage: &cec [-CT num] [-nmdasvh]\n");
  Abc_Print(-2,"\t         new combinational equivalence checker\n");
  Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
            (ulong)(uint)local_6c.nBTLimit);
  Abc_Print(-2,"\t-T num : approximate runtime limit in seconds [default = %d]\n",
            (ulong)(uint)local_6c.TimeLimit);
  pcVar12 = "yes";
  pcVar11 = "yes";
  if (local_6c.fNaive == 0) {
    pcVar11 = "no";
  }
  Abc_Print(-2,"\t-n     : toggle using naive SAT-based checking [default = %s]\n",pcVar11);
  pcVar11 = "miter";
  if (!bVar3) {
    pcVar11 = "two circuits";
  }
  Abc_Print(-2,"\t-m     : toggle miter vs. two circuits [default = %s]\n",pcVar11);
  pcVar11 = "yes";
  if (!bVar2) {
    pcVar11 = "no";
  }
  Abc_Print(-2,"\t-d     : toggle using dual output miter [default = %s]\n",pcVar11);
  pcVar11 = "yes";
  if (!bVar4) {
    pcVar11 = "no";
  }
  Abc_Print(-2,"\t-a     : toggle writing dual-output miter [default = %s]\n",pcVar11);
  pcVar11 = "yes";
  if (local_6c.fSilent == 0) {
    pcVar11 = "no";
  }
  Abc_Print(-2,"\t-s     : toggle silent operation [default = %s]\n",pcVar11);
  if (local_6c.fVerbose == 0) {
    pcVar12 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar12);
  pcVar11 = "\t-h     : print the command usage\n";
  iVar7 = -2;
LAB_00281146:
  Abc_Print(iVar7,pcVar11);
  return 1;
LAB_002811fc:
  pcVar11 = *ppcVar8;
  pcVar12 = pcVar11;
  do {
    if (*pcVar12 == '>') {
      *pcVar12 = '\\';
    }
    else if (*pcVar12 == '\0') break;
    pcVar12 = pcVar12 + 1;
  } while( true );
  pFVar9 = fopen(pcVar11,"r");
  if (pFVar9 == (FILE *)0x0) {
    Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar11);
    pcVar11 = Extra_FileGetSimilarName
                        (pcVar11,".aig",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    local_48[lVar13] = pcVar11;
    goto LAB_002814c7;
  }
  fclose(pFVar9);
  pGVar10 = Gia_AigerRead(pcVar11,0,0,0);
  *ppGVar14 = pGVar10;
  if (pGVar10 == (Gia_Man_t *)0x0) {
    Abc_Print(-1,"Reading AIGER from file \"%s\" has failed.\n",pcVar11);
    return 0;
  }
  lVar13 = 1;
  ppcVar8 = local_48 + 1;
  bVar3 = !bVar2;
  pAbc_00 = local_80;
  ppGVar14 = &local_78;
  pGVar10 = local_88;
  bVar2 = false;
  if (bVar3) goto LAB_002813f6;
  goto LAB_002811fc;
LAB_0028139f:
  if (*pcVar11 == '>') {
    *pcVar11 = '\\';
  }
  else if (*pcVar11 == '\0') {
    pFVar9 = fopen(pcVar12,"r");
    if (pFVar9 == (FILE *)0x0) {
      Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar12);
      pcVar11 = Extra_FileGetSimilarName
                          (pcVar12,".aig",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
LAB_002814c7:
      if (pcVar11 != (char *)0x0) {
        Abc_Print(1,"Did you mean \"%s\"?",pcVar11);
      }
      pcVar11 = "\n";
      iVar7 = 1;
      iVar5 = 1;
    }
    else {
      fclose(pFVar9);
      iVar7 = 0;
      local_78 = Gia_AigerRead(pcVar12,0,0,0);
      if (local_78 != (Gia_Man_t *)0x0) {
LAB_002813f6:
        p = local_78;
        pInit = Gia_ManMiter(pGVar10,local_78,0,1,0,0,local_6c.fVerbose);
        if (pInit != (Gia_Man_t *)0x0) {
          if (bVar4) {
            Abc_Print(0,"The verification miter is written into file \"%s\".\n","cec_miter.aig");
            Gia_AigerWrite(pInit,"cec_miter.aig",0,0,0);
          }
          iVar7 = Cec_ManVerify(pInit,&local_6c);
          pAbc_00->Status = iVar7;
          Abc_FrameReplaceCex(pAbc_00,&pGVar10->pCexComb);
          Gia_ManStop(pInit);
        }
        if (pGVar10 != pAbc_00->pGia) {
          Gia_ManStop(pGVar10);
        }
        Gia_ManStop(p);
        return 0;
      }
      pcVar11 = "Reading AIGER has failed.\n";
      iVar5 = -1;
      local_78 = (Gia_Man_t *)0x0;
    }
    Abc_Print(iVar5,pcVar11);
    return iVar7;
  }
  pcVar11 = pcVar11 + 1;
  goto LAB_0028139f;
}

Assistant:

int Abc_CommandAbc9Cec( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cec_ParCec_t ParsCec, * pPars = &ParsCec;
    FILE * pFile;
    Gia_Man_t * pGias[2] = {NULL, NULL}, * pMiter;
    char ** pArgvNew;
    int c, nArgcNew, fMiter = 0, fDualOutput = 0, fDumpMiter = 0;
    Cec_ManCecSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CTnmdasvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeLimit < 0 )
                goto usage;
            break;
        case 'n':
            pPars->fNaive ^= 1;
            break;
        case 'm':
            fMiter ^= 1;
            break;
        case 'd':
            fDualOutput ^= 1;
            break;
        case 'a':
            fDumpMiter ^= 1;
            break;
        case 's':
            pPars->fSilent ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( fMiter )
    {
        if ( pAbc->pGia == NULL || nArgcNew != 0 )
        {
            Abc_Print( -1, "Abc_CommandAbc9Cec(): A miter cannot be given as an argument of command &cec and should be entered using &r.\n" );
            return 1;
        }
        if ( fDualOutput )
        {
            if ( Gia_ManPoNum(pAbc->pGia) & 1 )
            {
                Abc_Print( -1, "The dual-output miter should have an even number of outputs.\n" );
                return 1;
            }
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a double-output miter.\n" );
            pAbc->Status = Cec_ManVerify( pAbc->pGia, pPars );
        }
        else
        {
            Gia_Man_t * pTemp;
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a single-output miter.\n" );
            pTemp = Gia_ManDemiterToDual( pAbc->pGia );
            pAbc->Status = Cec_ManVerify( pTemp, pPars );
            ABC_SWAP( Abc_Cex_t *, pAbc->pGia->pCexComb, pTemp->pCexComb );
            Gia_ManStop( pTemp );
        }
        Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexComb );
        return 0;
    }
    if ( nArgcNew > 2 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Cec(): Wrong number of command-line arguments.\n" );
        return 1;
    }
    if ( nArgcNew == 2 )
    {
        char * pFileNames[2] = { pArgvNew[0], pArgvNew[1] }, * pTemp;
        int n;
        for ( n = 0; n < 2; n++ )
        {
            // fix the wrong symbol
            for ( pTemp = pFileNames[n]; *pTemp; pTemp++ )
                if ( *pTemp == '>' )
                    *pTemp = '\\';
            if ( (pFile = fopen( pFileNames[n], "r" )) == NULL )
            {
                Abc_Print( -1, "Cannot open input file \"%s\". ", pFileNames[n] );
                if ( (pFileNames[n] = Extra_FileGetSimilarName( pFileNames[n], ".aig", NULL, NULL, NULL, NULL )) )
                    Abc_Print( 1, "Did you mean \"%s\"?", pFileNames[n] );
                Abc_Print( 1, "\n" );
                return 1;
            }
            fclose( pFile );
            pGias[n] = Gia_AigerRead( pFileNames[n], 0, 0, 0 );
            if ( pGias[n] == NULL )
            {
                Abc_Print( -1, "Reading AIGER from file \"%s\" has failed.\n", pFileNames[n] );
                return 0;
            }
        }
    }
    else
    {
        char * FileName, * pTemp;
        if ( pAbc->pGia == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9Cec(): There is no current AIG.\n" );
            return 1;
        }
        pGias[0] = pAbc->pGia;
        if ( nArgcNew == 1 )
            FileName = pArgvNew[0];
        else
        {
            assert( nArgcNew == 0 );
            if ( pAbc->pGia->pSpec == NULL )
            {
                Abc_Print( -1, "File name is not given on the command line.\n" );
                return 1;
            }
            FileName = pAbc->pGia->pSpec;
        }
        // fix the wrong symbol
        for ( pTemp = FileName; *pTemp; pTemp++ )
            if ( *pTemp == '>' )
                *pTemp = '\\';
        if ( (pFile = fopen( FileName, "r" )) == NULL )
        {
            Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
            if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", NULL, NULL, NULL, NULL )) )
                Abc_Print( 1, "Did you mean \"%s\"?", FileName );
            Abc_Print( 1, "\n" );
            return 1;
        }
        fclose( pFile );
        pGias[1] = Gia_AigerRead( FileName, 0, 0, 0 );
        if ( pGias[1] == NULL )
        {
            Abc_Print( -1, "Reading AIGER has failed.\n" );
            return 0;
        }
    }
    // compute the miter
    pMiter = Gia_ManMiter( pGias[0], pGias[1], 0, 1, 0, 0, pPars->fVerbose );
    if ( pMiter )
    {
        if ( fDumpMiter )
        {
            Abc_Print( 0, "The verification miter is written into file \"%s\".\n", "cec_miter.aig" );
            Gia_AigerWrite( pMiter, "cec_miter.aig", 0, 0, 0 );
        }
        pAbc->Status = Cec_ManVerify( pMiter, pPars );
        Abc_FrameReplaceCex( pAbc, &pGias[0]->pCexComb );
        Gia_ManStop( pMiter );
    }
    if ( pGias[0] != pAbc->pGia )
        Gia_ManStop( pGias[0] );
    Gia_ManStop( pGias[1] );
    return 0;

usage:
    Abc_Print( -2, "usage: &cec [-CT num] [-nmdasvh]\n" );
    Abc_Print( -2, "\t         new combinational equivalence checker\n" );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-T num : approximate runtime limit in seconds [default = %d]\n", pPars->TimeLimit );
    Abc_Print( -2, "\t-n     : toggle using naive SAT-based checking [default = %s]\n", pPars->fNaive? "yes":"no");
    Abc_Print( -2, "\t-m     : toggle miter vs. two circuits [default = %s]\n", fMiter? "miter":"two circuits");
    Abc_Print( -2, "\t-d     : toggle using dual output miter [default = %s]\n", fDualOutput? "yes":"no");
    Abc_Print( -2, "\t-a     : toggle writing dual-output miter [default = %s]\n", fDumpMiter? "yes":"no");
    Abc_Print( -2, "\t-s     : toggle silent operation [default = %s]\n", pPars->fSilent ? "yes":"no");
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", pPars->fVerbose? "yes":"no");
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}